

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O1

void test_bogus_name(wins *wins_ar,int ar_len)

{
  long *plVar1;
  long lVar2;
  Am_Font bogus_font;
  
  Am_Font::Am_Font(&bogus_font,"*-Bogus-Font-*");
  if (0 < ar_len) {
    lVar2 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->font_win + lVar2);
      (**(code **)(*plVar1 + 0x170))
                (plVar1,&black,"This is Bogus",0xd,&bogus_font,0x50,0x14,0,&Am_No_Style,0);
      (**(code **)(*plVar1 + 0xa0))(plVar1);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar2);
  }
  Am_Font::~Am_Font(&bogus_font);
  return;
}

Assistant:

void
test_bogus_name(wins *wins_ar, int ar_len)
{
  Am_Font bogus_font("*-Bogus-Font-*");
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "This is Bogus", 13, bogus_font, 80, 20);
    font_win->Flush_Output();
  }
}